

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O1

bool TestCompressionF<Counter<unsigned_short,16u>,Counter<unsigned_char,4u>>(int bias)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  byte bVar8;
  short sVar9;
  uint recent;
  uint uVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  
  iVar7 = 0;
  bVar8 = 0;
  sVar9 = 0;
  bVar13 = false;
  uVar3 = 0;
  do {
    bVar4 = (bVar8 & 0xf) * '\x02';
    uVar5 = (ushort)uVar3 & 0xf;
    uVar10 = 0;
    uVar12 = uVar3;
    do {
      if (uVar10 < uVar3) {
        iVar11 = 7;
        if ((int)uVar12 < 8 - bias) {
LAB_00102433:
          uVar1 = (ushort)uVar10;
          uVar6 = uVar1 & 0x10 | uVar5;
          uVar2 = uVar1 & 0xf;
          if (uVar2 < uVar5) {
            if ((ushort)(8 - bias) <= (ushort)(uVar5 - uVar2)) {
              uVar6 = uVar6 - 0x10;
            }
          }
          else if ((ushort)(bias + 8) < (ushort)(uVar2 - uVar5)) {
            uVar6 = uVar6 + 0x10;
          }
          iVar11 = 1;
          if ((uVar6 == (ushort)uVar3) &&
             ((bias != 0 ||
              ((ushort)(((bVar4 >> 4 & 1) * 0x10 + sVar9) - ((ushort)uVar12 & 0xf)) == uVar1)))) {
            iVar11 = 0;
          }
        }
      }
      else {
        if ((int)(iVar7 + uVar10) <= bias + 8) goto LAB_00102433;
        iVar11 = 7;
      }
      if ((iVar11 != 7) && (iVar11 != 0)) goto LAB_001024c8;
      uVar10 = uVar10 + 1;
      bVar4 = bVar4 - 2;
      uVar12 = uVar12 - 1;
    } while (uVar10 != 0x20);
    iVar11 = 5;
LAB_001024c8:
    if ((iVar11 != 5) && (iVar11 != 0)) {
      return bVar13;
    }
    bVar13 = 0x1e < uVar3;
    uVar3 = uVar3 + 1;
    sVar9 = sVar9 + 1;
    bVar8 = bVar8 + 1;
    iVar7 = iVar7 + -1;
    if (uVar3 == 0x20) {
      return bVar13;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}